

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O1

string * duckdb::StandardStringCast<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long input)

{
  char *pcVar1;
  Vector v;
  LogicalType LStack_a8;
  Vector local_90;
  anon_union_16_2_67f50693_for_value local_28;
  
  LogicalType::LogicalType(&LStack_a8,VARCHAR);
  Vector::Vector(&local_90,&LStack_a8,0x800);
  LogicalType::~LogicalType(&LStack_a8);
  local_28.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       NumericHelper::FormatSigned<unsigned_long>(input,&local_90);
  pcVar1 = local_28._8_8_;
  if ((ulong)local_28._0_4_ < 0xd) {
    pcVar1 = local_28.pointer.prefix;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + local_28._0_4_);
  if (local_90.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_90.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_90.type);
  return __return_storage_ptr__;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}